

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc-1123_type.h
# Opt level: O0

bool date::rfc1123::write<std::ostreambuf_iterator<char,std::char_traits<char>>>
               (parts *dt,ostreambuf_iterator<char,_std::char_traits<char>_> *dst)

{
  bool bVar1;
  const_reference value;
  const_reference value_00;
  const_reference value_01;
  undefined1 local_2f0 [8];
  array<std::pair<date::static_string<char,_4UL>,_short>,_11UL> zone_aliases;
  array<std::pair<date::static_string<char,_4UL>,_unsigned_char>,_12UL> month_aliases;
  array<std::pair<date::static_string<char,_4UL>,_unsigned_char>,_7UL> weekday_aliases;
  ostreambuf_iterator<char,_std::char_traits<char>_> *dst_local;
  parts *dt_local;
  
  bVar1 = validate(dt);
  if (bVar1) {
    memcpy(&month_aliases._M_elems[0xb].second,&DAT_001244e8,0xa8);
    memcpy(&zone_aliases._M_elems[10].second,&DAT_00124590,0x120);
    memcpy(local_2f0,&DAT_001246b0,0x108);
    value = std::array<std::pair<date::static_string<char,_4UL>,_unsigned_char>,_7UL>::operator[]
                      ((array<std::pair<date::static_string<char,_4UL>,_unsigned_char>,_7UL> *)
                       &month_aliases._M_elems[0xb].second,(long)(int)(dt->week_day - 1));
    characters_writer::write<std::ostreambuf_iterator<char,std::char_traits<char>>,char,4ul>
              (dst,&value->first);
    characters_writer::write<std::ostreambuf_iterator<char,std::char_traits<char>>,char>(dst,',');
    characters_writer::write<std::ostreambuf_iterator<char,std::char_traits<char>>,char>(dst,' ');
    number_writer<2>::write<std::ostreambuf_iterator<char,std::char_traits<char>>,unsigned_char>
              (dst,dt->day);
    characters_writer::write<std::ostreambuf_iterator<char,std::char_traits<char>>,char>(dst,' ');
    value_00 = std::array<std::pair<date::static_string<char,_4UL>,_unsigned_char>,_12UL>::
               operator[]((array<std::pair<date::static_string<char,_4UL>,_unsigned_char>,_12UL> *)
                          &zone_aliases._M_elems[10].second,(long)(int)(dt->month - 1));
    characters_writer::write<std::ostreambuf_iterator<char,std::char_traits<char>>,char,4ul>
              (dst,&value_00->first);
    characters_writer::write<std::ostreambuf_iterator<char,std::char_traits<char>>,char>(dst,' ');
    number_writer<4>::write<std::ostreambuf_iterator<char,std::char_traits<char>>,unsigned_short>
              (dst,dt->year);
    characters_writer::write<std::ostreambuf_iterator<char,std::char_traits<char>>,char>(dst,' ');
    number_writer<2>::write<std::ostreambuf_iterator<char,std::char_traits<char>>,unsigned_char>
              (dst,dt->hour);
    characters_writer::write<std::ostreambuf_iterator<char,std::char_traits<char>>,char>(dst,':');
    number_writer<2>::write<std::ostreambuf_iterator<char,std::char_traits<char>>,unsigned_char>
              (dst,dt->minute);
    characters_writer::write<std::ostreambuf_iterator<char,std::char_traits<char>>,char>(dst,':');
    number_writer<2>::write<std::ostreambuf_iterator<char,std::char_traits<char>>,unsigned_char>
              (dst,dt->second);
    characters_writer::write<std::ostreambuf_iterator<char,std::char_traits<char>>,char>(dst,' ');
    value_01 = std::array<std::pair<date::static_string<char,_4UL>,_short>,_11UL>::operator[]
                         ((array<std::pair<date::static_string<char,_4UL>,_short>,_11UL> *)local_2f0
                          ,1);
    characters_writer::write<std::ostreambuf_iterator<char,std::char_traits<char>>,char,4ul>
              (dst,&value_01->first);
  }
  return bVar1;
}

Assistant:

static bool write(const parts& dt, Iterator& dst)
    {
        if (!validate(dt))
            return false;

        using char_type = typename iterator_traits<Iterator>::value_type;
        constexpr auto weekday_aliases = weekday_names<char_type>();
        constexpr auto month_aliases = month_names<char_type>();
        constexpr auto zone_aliases = zone_names<char_type>();

        characters_writer::write(dst, weekday_aliases[dt.week_day - 1].first);
        characters_writer::write(dst, char_type{ ',' });
        characters_writer::write(dst, char_type{ ' ' });
        number_writer<2>::write(dst, dt.day);
        characters_writer::write(dst, char_type{ ' ' });
        characters_writer::write(dst, month_aliases[dt.month - 1].first);
        characters_writer::write(dst, char_type{ ' ' });
        number_writer<4>::write(dst, dt.year);
        characters_writer::write(dst, char_type{ ' ' });
        number_writer<2>::write(dst, dt.hour);
        characters_writer::write(dst, char_type{ ':' });
        number_writer<2>::write(dst, dt.minute);
        characters_writer::write(dst, char_type{ ':' });
        number_writer<2>::write(dst, dt.second);
        characters_writer::write(dst, char_type{ ' ' });
        characters_writer::write(dst, zone_aliases[1].first);

        return true;
    }